

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arg_Data.h
# Opt level: O2

void __thiscall
Nova::Arg_Data::Arg_Data
          (Arg_Data *this,string *input_str,string *input_val_name,string *input_desc,
          string *default_value)

{
  allocator local_59;
  string *local_58;
  string local_50;
  
  this->type = STRING;
  (this->str)._M_dataplus._M_p = (pointer)&(this->str).field_2;
  (this->str)._M_string_length = 0;
  (this->str).field_2._M_local_buf[0] = '\0';
  (this->val_name)._M_dataplus._M_p = (pointer)&(this->val_name).field_2;
  (this->val_name)._M_string_length = 0;
  (this->val_name).field_2._M_local_buf[0] = '\0';
  (this->desc)._M_dataplus._M_p = (pointer)&(this->desc).field_2;
  (this->desc)._M_string_length = 0;
  (this->desc).field_2._M_local_buf[0] = '\0';
  this->boolean_value = false;
  this->integer_default = 0;
  this->integer_value = 0;
  this->double_default = 0.0;
  this->double_value = 0.0;
  (this->vector_2d_default)._data._M_elems[0] = 0.0;
  (this->vector_2d_default)._data._M_elems[1] = 0.0;
  (this->vector_2d_value)._data._M_elems[0] = 0.0;
  (this->vector_2d_value)._data._M_elems[1] = 0.0;
  Vector<double,_3,_true>::Vector(&this->vector_3d_default);
  Vector<double,_3,_true>::Vector(&this->vector_3d_value);
  local_58 = &this->string_default;
  std::__cxx11::string::string((string *)local_58,(string *)default_value);
  std::__cxx11::string::string((string *)&this->string_value,(string *)default_value);
  (this->list_value).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list_value).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->list_value).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&local_50,"string",&local_59);
  Initialize(this,input_str,input_val_name,input_desc,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

Arg_Data(const std::string& input_str,const std::string& input_val_name,const std::string& input_desc,const std::string& default_value)
        :type(STRING),boolean_value(false),integer_default(0),integer_value(0),double_default(0),double_value(0),string_default(default_value),string_value(default_value)
    {
        Initialize(input_str,input_val_name,input_desc,"string");
    }